

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.h
# Opt level: O1

void __thiscall
FlowEdge::SetPathDependentInfo(FlowEdge *this,PathDependentInfo *info,JitArenaAllocator *alloc)

{
  code *pcVar1;
  Value *pVVar2;
  PathDependentRelationship PVar3;
  undefined3 uVar4;
  bool bVar5;
  undefined4 *puVar6;
  PathDependentInfo *pPVar7;
  
  if (info->leftValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.h"
                       ,0x21a,"(info.HasInfo())","info.HasInfo()");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pPVar7 = this->pathDependentInfo;
  if (pPVar7 == (PathDependentInfo *)0x0) {
    pPVar7 = (PathDependentInfo *)new<Memory::JitArenaAllocator>(0x18,alloc,0x3f1274);
    pVVar2 = info->rightValue;
    pPVar7->leftValue = info->leftValue;
    pPVar7->rightValue = pVVar2;
    PVar3 = info->relationship;
    uVar4 = *(undefined3 *)&info->field_0x15;
    pPVar7->rightConstantValue = info->rightConstantValue;
    pPVar7->relationship = PVar3;
    *(undefined3 *)&pPVar7->field_0x15 = uVar4;
    this->pathDependentInfo = pPVar7;
  }
  else {
    *(undefined8 *)((long)&pPVar7->rightValue + 5) = *(undefined8 *)((long)&info->rightValue + 5);
    pVVar2 = info->rightValue;
    pPVar7->leftValue = info->leftValue;
    pPVar7->rightValue = pVVar2;
  }
  return;
}

Assistant:

void SetPathDependentInfo(const PathDependentInfo &info, JitArenaAllocator *const alloc)
    {
        Assert(info.HasInfo());

        if (!pathDependentInfo)
        {
            pathDependentInfo = JitAnew(alloc, PathDependentInfo, info);
        }
        else
        {
            *pathDependentInfo = info;
        }
    }